

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_leaflist(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  uint uVar1;
  lysp_node *plVar2;
  lysp_ext_instance *object;
  LY_ERR LVar3;
  lysp_node *parent;
  lysp_node *plVar4;
  LY_ERR LVar5;
  ly_ctx *plVar6;
  yin_subelement subelems [14];
  yin_subelement local_188;
  undefined4 local_170;
  lysp_node *local_168;
  undefined2 local_160;
  undefined4 local_158;
  char **local_150;
  undefined2 local_148;
  undefined4 local_140;
  lysp_qname **local_138;
  undefined2 local_130;
  undefined4 local_128;
  lysp_node *local_120;
  undefined2 local_118;
  undefined4 local_110;
  lysp_node *local_108;
  undefined2 local_100;
  undefined4 local_f8;
  lysp_node *local_f0;
  undefined2 local_e8;
  undefined4 local_e0;
  uint16_t *local_d8;
  undefined2 local_d0;
  undefined4 local_c8;
  char **local_c0;
  undefined2 local_b8;
  undefined4 local_b0;
  uint16_t *local_a8;
  undefined2 local_a0;
  undefined4 local_98;
  lysp_node **local_90;
  undefined2 local_88;
  undefined4 local_80;
  lysp_ext_instance **local_78;
  undefined2 local_70;
  undefined4 local_68;
  uint16_t *local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  parent = (lysp_node *)calloc(1,0xd0);
  if (parent == (lysp_node *)0x0) {
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_leaflist"
          );
  }
  else {
    plVar2 = *node_meta->nodes;
    if (plVar2 == (lysp_node *)0x0) {
      *node_meta->nodes = parent;
    }
    else {
      do {
        plVar4 = plVar2;
        plVar2 = plVar4->next;
      } while (plVar2 != (lysp_node *)0x0);
      plVar4->next = parent;
    }
  }
  if (parent == (lysp_node *)0x0) {
    LVar5 = LY_EMEM;
  }
  else {
    parent->nodetype = 8;
    parent->parent = node_meta->parent;
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    LVar5 = LVar3 + (LVar3 == LY_SUCCESS);
    if ((LVar3 == LY_SUCCESS) &&
       (LVar5 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,LY_STMT_LEAF_LIST),
       LVar5 == LY_SUCCESS)) {
      local_188.type = LY_STMT_CONFIG;
      local_188.dest = &parent->flags;
      local_188.flags = 2;
      local_170 = 0x70000;
      local_160 = 0;
      local_158 = 0x80000;
      local_150 = &parent->dsc;
      local_148 = 2;
      local_140 = 0x130000;
      local_138 = &parent->iffeatures;
      local_130 = 0;
      local_128 = 0x190000;
      local_118 = 2;
      local_110 = 0x1a0000;
      local_100 = 2;
      local_f8 = 0x1d0000;
      local_f0 = parent + 1;
      local_e8 = 0;
      local_e0 = 0x1f0000;
      local_d0 = 2;
      local_c8 = 0x270000;
      local_c0 = &parent->ref;
      local_b8 = 2;
      local_b0 = 0x2c0000;
      local_a0 = 2;
      local_98 = 0x2e0000;
      local_90 = &parent[1].next;
      local_88 = 3;
      local_80 = 0x310000;
      local_78 = &parent[2].exts;
      local_70 = 2;
      local_68 = 0x330000;
      local_60 = &parent[1].nodetype;
      local_58 = 2;
      uStack_48 = 0;
      local_40 = 0;
      local_50 = 0xf0000;
      local_168 = parent + 3;
      local_120 = parent;
      local_108 = parent;
      local_d8 = (uint16_t *)local_188.dest;
      local_a8 = (uint16_t *)local_188.dest;
      LVar5 = yin_parse_content(ctx,&local_188,0xe,parent,LY_STMT_LEAF_LIST,(char **)0x0,
                                &parent->exts);
      if (LVar5 == LY_SUCCESS) {
        object = parent->exts;
        LVar5 = LY_SUCCESS;
        if (object != (lysp_ext_instance *)0x0) {
          LVar5 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
        }
        if (LVar5 == LY_SUCCESS) {
          uVar1._0_2_ = parent[3].nodetype;
          uVar1._2_2_ = parent[3].flags;
          if ((uVar1 == 0) || (parent[3].parent == (lysp_node *)0x0)) {
            if (uVar1 <= *(uint *)&parent[3].field_0xc || *(uint *)&parent[3].field_0xc == 0) {
              return LY_SUCCESS;
            }
            if (ctx == (lysp_yin_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar6,(char *)0x0,LYVE_SEMANTICS,
                    "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                   );
          }
          else {
            if (ctx == (lysp_yin_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YIN,
                    "Invalid combination of sub-elemnts \"%s\" and \"%s\" in \"%s\" element.",
                    "min-elements","default","leaf-list");
          }
          LVar5 = LY_EVALID;
        }
      }
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
yin_parse_leaflist(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_leaflist *llist;

    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, llist, next, LY_EMEM);

    llist->nodetype = LYS_LEAFLIST;
    llist->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &llist->name, Y_IDENTIF_ARG, LY_STMT_LEAF_LIST));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_CONFIG, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEFAULT, &llist->dflts, 0},
        {LY_STMT_DESCRIPTION, &llist->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &llist->iffeatures, 0},
        {LY_STMT_MAX_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MIN_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MUST, &llist->musts, 0},
        {LY_STMT_ORDERED_BY, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &llist->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_TYPE, &llist->type, YIN_SUBELEM_UNIQUE | YIN_SUBELEM_MANDATORY},
        {LY_STMT_UNITS, &llist->units, YIN_SUBELEM_UNIQUE},
        {LY_STMT_WHEN, &llist->when, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), llist, LY_STMT_LEAF_LIST, NULL, &llist->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, llist->exts));

    /* check invalid combination of subelements */
    if ((llist->min) && (llist->dflts)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INCHILDSTMSCOMB_YIN, "min-elements", "default", "leaf-list");
        return LY_EVALID;
    }
    if (llist->max && (llist->min > llist->max)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_MINMAX, llist->min, llist->max);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}